

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::JitAllocatorPool::reset(JitAllocatorPool *this)

{
  JitAllocatorPool *this_local;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  this->cursor = (JitAllocatorBlock *)0x0;
  this->blockCount = 0;
  this->totalAreaSize[0] = 0;
  this->totalAreaSize[1] = 0;
  this->totalAreaUsed[0] = 0;
  this->totalAreaUsed[1] = 0;
  this->totalOverheadBytes = 0;
  return;
}

Assistant:

inline void reset() noexcept {
    blocks.reset();
    cursor = nullptr;
    blockCount = 0u;
    totalAreaSize[0] = 0u;
    totalAreaSize[1] = 0u;
    totalAreaUsed[0] = 0u;
    totalAreaUsed[1] = 0u;
    totalOverheadBytes = 0u;
  }